

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

VarType * deqp::gles2::Functional::generateRandomType
                    (VarType *__return_storage_ptr__,int maxDepth,int *curStructIdx,
                    vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                    *structTypesDst,Random *rnd)

{
  DataType basicType;
  iterator __position;
  long *name;
  deRandom *rnd_00;
  uint uVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  StructType *pSVar3;
  long *plVar4;
  long *plVar5;
  Precision precision;
  int iVar6;
  int iVar7;
  bool bVar8;
  float fVar9;
  StructType *structType;
  StructType *local_220;
  int local_214;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  deRandom *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  VarType *local_1c8;
  undefined8 local_1c0;
  vector<glu::StructType_const*,std::allocator<glu::StructType_const*>> *local_1b8;
  int *local_1b0;
  VarType local_1a8 [4];
  ios_base local_138 [264];
  
  local_214 = maxDepth;
  local_1b0 = curStructIdx;
  if (maxDepth < 1) {
    bVar8 = false;
  }
  else {
    fVar9 = deRandom_getFloat(&rnd->m_rnd);
    bVar8 = fVar9 < 0.2;
  }
  fVar9 = deRandom_getFloat(&rnd->m_rnd);
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  if (bVar8) {
    local_1c0 = CONCAT44(extraout_var,dVar2);
    pSVar3 = (StructType *)operator_new(0x38);
    iVar6 = *local_1b0;
    *local_1b0 = iVar6 + 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,iVar6);
    std::__cxx11::stringbuf::str();
    local_1f0 = &rnd->m_rnd;
    local_1b8 = (vector<glu::StructType_const*,std::allocator<glu::StructType_const*>> *)
                structTypesDst;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x1c0ba52);
    local_210 = &local_200;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_200 = *plVar5;
      lStack_1f8 = plVar4[3];
    }
    else {
      local_200 = *plVar5;
      local_210 = (long *)*plVar4;
    }
    local_208 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pSVar3,(char *)local_210,(allocator<char> *)local_1a8);
    uVar1 = (uint)local_1c0;
    (pSVar3->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar3->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar3->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    local_1c8 = __return_storage_ptr__;
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    iVar7 = (int)local_1c0;
    local_214 = local_214 + -1;
    iVar6 = 0;
    local_220 = pSVar3;
    do {
      pSVar3 = local_220;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x1aecf69);
      local_210 = &local_200;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_200 = *plVar5;
        lStack_1f8 = plVar4[3];
      }
      else {
        local_200 = *plVar5;
        local_210 = (long *)*plVar4;
      }
      name = local_210;
      local_208 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      generateRandomType(local_1a8,local_214,local_1b0,
                         (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                          *)local_1b8,(Random *)local_1f0);
      glu::StructType::addMember(pSVar3,(char *)name,local_1a8);
      glu::VarType::~VarType(local_1a8);
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 <= (int)(iVar7 + (uVar1 / 5) * -5));
    __position._M_current = *(StructType ***)(local_1b8 + 8);
    if (__position._M_current == *(StructType ***)(local_1b8 + 0x10)) {
      std::vector<glu::StructType_const*,std::allocator<glu::StructType_const*>>::
      _M_realloc_insert<glu::StructType_const*const&>(local_1b8,__position,&local_220);
    }
    else {
      *__position._M_current = local_220;
      *(long *)(local_1b8 + 8) = *(long *)(local_1b8 + 8) + 8;
    }
    __return_storage_ptr__ = local_1c8;
    rnd_00 = local_1f0;
    if (0.3 <= fVar9) {
      glu::VarType::VarType(local_1c8,local_220);
    }
    else {
      glu::VarType::VarType(local_1a8,local_220);
      dVar2 = deRandom_getUint32(rnd_00);
      glu::VarType::VarType(__return_storage_ptr__,local_1a8,dVar2 % 5 + 1);
    }
  }
  else {
    basicType = (&s_testDataTypes)[dVar2 % 0x11];
    bVar8 = basicType - TYPE_BOOL < 4;
    precision = bVar8 + 1 + (uint)bVar8;
    if (0.3 <= fVar9) {
      glu::VarType::VarType(__return_storage_ptr__,basicType,precision);
    }
    else {
      glu::VarType::VarType(local_1a8,basicType,precision);
      dVar2 = deRandom_getUint32(&rnd->m_rnd);
      glu::VarType::VarType(__return_storage_ptr__,local_1a8,dVar2 % 5 + 1);
    }
  }
  if (fVar9 < 0.3) {
    glu::VarType::~VarType(local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

static glu::VarType generateRandomType (const int maxDepth, int& curStructIdx, vector<const StructType*>& structTypesDst, Random& rnd)
{
	const bool isStruct		= maxDepth > 0 && rnd.getFloat() < 0.2f;
	const bool isArray		= rnd.getFloat() < 0.3f;

	if (isStruct)
	{
		const int			numMembers = rnd.getInt(1, 5);
		StructType* const	structType = new StructType(("structType" + de::toString(curStructIdx++)).c_str());

		for (int i = 0; i < numMembers; i++)
			structType->addMember(("m" + de::toString(i)).c_str(), generateRandomType(maxDepth-1, curStructIdx, structTypesDst, rnd));

		structTypesDst.push_back(structType);
		return isArray ? glu::VarType(glu::VarType(structType), rnd.getInt(1, 5)) : glu::VarType(structType);
	}
	else
	{
		const glu::DataType		basicType = (glu::DataType)s_testDataTypes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testDataTypes)-1)];
		const glu::Precision	precision = glu::isDataTypeBoolOrBVec(basicType) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		return isArray ? glu::VarType(glu::VarType(basicType, precision), rnd.getInt(1, 5)) : glu::VarType(basicType, precision);
	}
}